

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ios_prop.h
# Opt level: O2

ios_info * booster::locale::impl::ios_prop<booster::locale::ios_info>::get(ios_base *ios)

{
  bool bVar1;
  int __ix;
  void **ppvVar2;
  ios_info iStack_68;
  
  __ix = get_id();
  bVar1 = has(ios);
  if (!bVar1) {
    ios_info::ios_info(&iStack_68);
    set(&iStack_68,ios);
    ios_info::~ios_info(&iStack_68);
  }
  ppvVar2 = std::ios_base::pword(ios,__ix);
  return (ios_info *)*ppvVar2;
}

Assistant:

static Property &get(std::ios_base &ios)
                {
                    int id=get_id();
                    if(!has(ios))
                        set(Property(),ios);
                    return *static_cast<Property *>(ios.pword(id));
                }